

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

Matrix<double> * __thiscall
nnad::Matrix<double>::Inverse(Matrix<double> *__return_storage_ptr__,Matrix<double> *this)

{
  int *Columns;
  ostream *poVar1;
  Matrix<double> adj;
  int local_70;
  int local_6c;
  Matrix<double> local_68;
  Matrix<double> *local_48;
  double local_40;
  double local_38;
  
  if (this->_Lines == this->_Columns) {
    Columns = &this->_Columns;
    local_68._Lines = 0xffffffff;
    Matrix(__return_storage_ptr__,&this->_Lines,Columns,&local_68._Lines);
    local_40 = Determinant(this);
    if ((local_40 != 0.0) || (NAN(local_40))) {
      Adjoint(&local_68,this);
      local_6c = 0;
      local_48 = this;
      if (0 < this->_Lines) {
        do {
          local_70 = 0;
          if (0 < *Columns) {
            do {
              local_38 = GetElement(&local_68,&local_6c,&local_70);
              local_38 = local_38 / local_40;
              SetElement(__return_storage_ptr__,&local_6c,&local_70,&local_38);
              local_70 = local_70 + 1;
            } while (local_70 < *Columns);
          }
          local_6c = local_6c + 1;
        } while (local_6c < local_48->_Lines);
      }
      if (local_68._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_68._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    local_68._0_8_ =
         &local_68._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"inverse: Singular matrix, can\'t find its inverse","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_68._0_8_,
                        (long)local_68._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\x1b[0m",4);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    local_68._0_8_ =
         &local_68._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"inverse: matrix must be square.","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_68._0_8_,
                        (long)local_68._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\x1b[0m",4);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  exit(-10);
}

Assistant:

Matrix<T> Inverse()
    {
      if (_Lines != _Columns)
        Error("inverse: matrix must be square.");

      Matrix<T> output{_Lines, _Columns};

      // Find Determinant
      T det = this->Determinant();
      if (det == 0)
        Error("inverse: Singular matrix, can't find its inverse");

      // Find Adjoint
      Matrix<T> adj = this->Adjoint();

      // Find Inverse using formula "inverse = adj/det"
      for (int i = 0; i < _Lines; i++)
        for (int j = 0; j < _Columns; j++)
          output.SetElement(i,j, adj.GetElement(i,j) / T{det});

      return output;
    }